

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

void __thiscall
wasm::Analyzer::Analyzer
          (Analyzer *this,Module *module,PassOptions *options,
          vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
          *roots)

{
  ModuleElement element_00;
  bool bVar1;
  reference ppVar2;
  bool local_ca;
  pair<wasm::ModuleElementKind,_wasm::Name> *element;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  *__range2;
  vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  *roots_local;
  PassOptions *options_local;
  Module *module_local;
  Analyzer *this_local;
  
  this->module = module;
  this->options = options;
  std::
  unordered_set<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  ::unordered_set(&this->used);
  std::
  unordered_set<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  ::unordered_set(&this->referenced);
  std::
  vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  ::vector(&this->moduleQueue);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&this->expressionQueue);
  std::
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  ::unordered_set(&this->calledSignatures);
  std::
  unordered_map<wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
  ::unordered_map(&this->uncalledRefFuncMap);
  std::
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ::unordered_set(&this->readStructFields);
  std::
  unordered_map<std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
  ::unordered_map(&this->unreadStructFieldExprMap);
  std::optional<wasm::SubTypes>::optional(&this->subTypes);
  __end2 = std::
           vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
           ::begin(roots);
  element = (pair<wasm::ModuleElementKind,_wasm::Name> *)
            std::
            vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
            ::end(roots);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
                                     *)&element), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
             ::operator*(&__end2);
    element_00.first = ppVar2->first;
    element_00._4_4_ = *(undefined4 *)&ppVar2->field_0x4;
    element_00.second.super_IString.str = (ppVar2->second).super_IString;
    use(this,element_00);
    __gnu_cxx::
    __normal_iterator<const_std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
    ::operator++(&__end2);
  }
  do {
    bVar1 = processExpressions(this);
    local_ca = true;
    if (!bVar1) {
      local_ca = processModule(this);
    }
  } while (local_ca != false);
  return;
}

Assistant:

Analyzer(Module* module,
           const PassOptions& options,
           const std::vector<ModuleElement>& roots)
    : module(module), options(options) {

    // All roots are used.
    for (auto& element : roots) {
      use(element);
    }

    // Main loop on both the module and the expression queues.
    while (processExpressions() || processModule()) {
    }
  }